

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O0

uintptr_t ht_feature_cached_string_push(HT_Timeline *timeline,char *label)

{
  HT_Bag *bag;
  void *data;
  HT_EventKlass *pHVar1;
  undefined1 local_78 [8];
  HT_StringMappingEvent ev;
  HT_Event ht_base_event;
  uintptr_t id;
  size_t i;
  HT_FeatureCachedString *f;
  char *label_local;
  HT_Timeline *timeline_local;
  
  bag = (HT_Bag *)timeline->features[1];
  if (bag == (HT_Bag *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/luisbg[P]hawktracer/lib/feature_cached_string.c"
                  ,0x1b,"uintptr_t ht_feature_cached_string_push(HT_Timeline *, const char *)");
  }
  data = (void *)djb2_hash(label);
  id = 0;
  while( true ) {
    if (bag->size <= id) {
      ht_bag_add(bag,data);
      ev.label = (char *)ht_HT_StringMappingEvent_get_event_klass_instance();
      pHVar1 = (HT_EventKlass *)ht_monotonic_clock_get_timestamp();
      ev.base.timestamp = ht_event_id_provider_next(timeline->id_provider);
      local_78 = (undefined1  [8])ev.label;
      ev.base.klass = pHVar1;
      ev.base.id = (HT_EventId)data;
      ev.hash = (uintptr_t)label;
      ht_timeline_push_event(timeline,(HT_Event *)local_78);
      return (uintptr_t)data;
    }
    if (bag->data[id] == data) break;
    id = id + 1;
  }
  return (uintptr_t)data;
}

Assistant:

uintptr_t
ht_feature_cached_string_push(HT_Timeline* timeline, const char* label)
{
    HT_FeatureCachedString* f = (HT_FeatureCachedString*)timeline->features[HT_FEATURE_CACHED_STRING];
    assert(f);
    size_t i;
    uintptr_t id = djb2_hash(label);

    for (i = 0; i < f->cached_data.size; i++)
    {
        if ((uintptr_t)f->cached_data.data[i] == id)
        {
            return id;
        }
    }

    ht_bag_add(&f->cached_data, (void*)id);
    HT_TIMELINE_PUSH_EVENT(timeline, HT_StringMappingEvent, id, label);

    return id;
}